

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  uint *puVar1;
  byte bVar2;
  element_type *peVar3;
  type_error *ptVar4;
  long *plVar5;
  size_type *psVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  byte bVar8;
  array<char,_512UL> *paVar9;
  uint uVar10;
  ulong unaff_R13;
  unsigned_long __val;
  long lVar11;
  stringstream local_278 [8];
  stringstream ss;
  long local_268 [2];
  undefined8 uStack_258;
  uint auStack_250 [50];
  char acStack_188 [152];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *local_50;
  array<char,_512UL> *local_48;
  string_t *local_40;
  uint local_38;
  byte local_31;
  
  uVar7 = CONCAT71(in_register_00000011,ensure_ascii);
  if (s->_M_string_length != 0) {
    paVar9 = &this->string_buffer;
    local_38 = (uint)uVar7;
    local_31 = !ensure_ascii;
    lVar11 = 0;
    __val = 0;
    bVar8 = 0;
    local_50 = this;
    local_48 = paVar9;
    local_40 = s;
    do {
      bVar2 = (s->_M_dataplus)._M_p[__val];
      if (bVar8 == 0) {
        uVar10 = 0xffU >> (serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                           ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar2] & 0x1f
                          ) & (uint)bVar2;
      }
      else {
        uVar10 = (int)unaff_R13 << 6 | bVar2 & 0x3f;
      }
      unaff_R13 = (ulong)uVar10;
      bVar8 = serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d
              [(ulong)(byte)serializer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                            ::decode(unsigned_char&,unsigned_int&,unsigned_char)::utf8d[bVar2] +
               (ulong)bVar8 * 0x10 + 0x100];
      if (bVar8 == 0) {
        switch(uVar10) {
        case 8:
          (paVar9->_M_elems + lVar11)[0] = '\\';
          (paVar9->_M_elems + lVar11)[1] = 'b';
          break;
        case 9:
          (paVar9->_M_elems + lVar11)[0] = '\\';
          (paVar9->_M_elems + lVar11)[1] = 't';
          break;
        case 10:
          (paVar9->_M_elems + lVar11)[0] = '\\';
          (paVar9->_M_elems + lVar11)[1] = 'n';
          break;
        case 0xb:
switchD_001219d6_caseD_b:
          if ((0x1f < uVar10 & (uVar10 < 0x7f | local_31)) == 0) {
            if (uVar10 < 0x10000) {
              snprintf(paVar9->_M_elems + lVar11,7,"\\u%04x",unaff_R13);
              lVar11 = lVar11 + 6;
            }
            else {
              snprintf(paVar9->_M_elems + lVar11,0xd,"\\u%04x\\u%04x",
                       (ulong)((uVar10 >> 10) + 0xd7c0 & 0xffff),(ulong)(uVar10 & 0x3ff | 0xdc00));
              lVar11 = lVar11 + 0xc;
            }
            uVar7 = (ulong)local_38;
            paVar9 = local_48;
            s = local_40;
          }
          else {
            paVar9->_M_elems[lVar11] = bVar2;
            lVar11 = lVar11 + 1;
          }
          goto LAB_00121a71;
        case 0xc:
          (paVar9->_M_elems + lVar11)[0] = '\\';
          (paVar9->_M_elems + lVar11)[1] = 'f';
          break;
        case 0xd:
          (paVar9->_M_elems + lVar11)[0] = '\\';
          (paVar9->_M_elems + lVar11)[1] = 'r';
          break;
        default:
          if (uVar10 == 0x22) {
            (paVar9->_M_elems + lVar11)[0] = '\\';
            (paVar9->_M_elems + lVar11)[1] = '\"';
          }
          else {
            if (uVar10 != 0x5c) goto switchD_001219d6_caseD_b;
            (paVar9->_M_elems + lVar11)[0] = '\\';
            (paVar9->_M_elems + lVar11)[1] = '\\';
          }
        }
        lVar11 = lVar11 + 2;
LAB_00121a71:
        if (lVar11 - 500U < 0xd) {
          peVar3 = (local_50->o).
                   super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          (*peVar3->_vptr_output_adapter_protocol[1])(peVar3,paVar9,lVar11);
          uVar7 = (ulong)local_38;
          lVar11 = 0;
          paVar9 = local_48;
          s = local_40;
        }
      }
      else {
        if (bVar8 == 1) {
          std::__cxx11::stringstream::stringstream(local_278);
          *(undefined8 *)((long)&uStack_258 + *(long *)(local_268[0] + -0x18)) = 2;
          puVar1 = (uint *)((long)auStack_250 + *(long *)(local_268[0] + -0x18));
          *puVar1 = *puVar1 | 0x4000;
          lVar11 = *(long *)(local_268[0] + -0x18);
          if (acStack_188[lVar11 + 1] == '\0') {
            std::ios::widen((char)local_268 + (char)lVar11);
            acStack_188[lVar11 + 1] = '\x01';
          }
          acStack_188[lVar11] = '0';
          *(uint *)((long)auStack_250 + *(long *)(local_268[0] + -0x18)) =
               *(uint *)((long)auStack_250 + *(long *)(local_268[0] + -0x18)) & 0xffffffb5 | 8;
          std::ostream::operator<<(local_268,(uint)bVar2);
          ptVar4 = (type_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::to_string(&local_b0,__val);
          std::operator+(&local_f0,"invalid UTF-8 byte at index ",&local_b0);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_70._M_dataplus._M_p = (pointer)*plVar5;
          psVar6 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
            local_70.field_2._M_allocated_capacity = *psVar6;
            local_70.field_2._8_8_ = plVar5[3];
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = *psVar6;
          }
          local_70._M_string_length = plVar5[1];
          *plVar5 = (long)psVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::stringbuf::str();
          std::operator+(&local_90,&local_70,&local_d0);
          type_error::create(ptVar4,0x13c,&local_90);
          __cxa_throw(ptVar4,&type_error::typeinfo,exception::~exception);
        }
        if ((char)uVar7 == '\0') {
          paVar9->_M_elems[lVar11] = bVar2;
          lVar11 = lVar11 + 1;
        }
      }
      __val = __val + 1;
    } while (__val < s->_M_string_length);
    if (bVar8 != 0) {
      std::__cxx11::stringstream::stringstream(local_278);
      *(undefined8 *)((long)&uStack_258 + *(long *)(local_268[0] + -0x18)) = 2;
      puVar1 = (uint *)((long)auStack_250 + *(long *)(local_268[0] + -0x18));
      *puVar1 = *puVar1 | 0x4000;
      lVar11 = *(long *)(local_268[0] + -0x18);
      if (acStack_188[lVar11 + 1] == '\0') {
        std::ios::widen((char)local_268 + (char)lVar11);
        acStack_188[lVar11 + 1] = '\x01';
      }
      acStack_188[lVar11] = '0';
      *(uint *)((long)auStack_250 + *(long *)(local_268[0] + -0x18)) =
           *(uint *)((long)auStack_250 + *(long *)(local_268[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<
                (local_268,(uint)(byte)(local_40->_M_dataplus)._M_p[local_40->_M_string_length - 1])
      ;
      ptVar4 = (type_error *)__cxa_allocate_exception(0x20);
      std::__cxx11::stringbuf::str();
      std::operator+(&local_90,"incomplete UTF-8 string; last byte: 0x",&local_70);
      type_error::create(ptVar4,0x13c,&local_90);
      __cxa_throw(ptVar4,&type_error::typeinfo,exception::~exception);
    }
    if (lVar11 != 0) {
      peVar3 = (local_50->o).
               super___shared_ptr<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar3->_vptr_output_adapter_protocol[1])(peVar3,paVar9,lVar11);
      return;
    }
  }
  return;
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        uint32_t codepoint;
        uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
                                                  static_cast<uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                  static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
                                                  static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    std::stringstream ss;
                    ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(byte);
                    JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + ss.str()));
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (not ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    break;
                }
            }
        }

        if (JSON_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            std::stringstream ss;
            ss << std::setw(2) << std::uppercase << std::setfill('0') << std::hex << static_cast<int>(static_cast<uint8_t>(s.back()));
            JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + ss.str()));
        }
    }